

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnndelem * trydelem(rnndb *db,char *file,xmlNode *node)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  uint64_t uVar6;
  rnnenum **pprVar7;
  rnndomain **pprVar8;
  rnngroup **pprVar9;
  rnndelem *prVar10;
  rnnbitset **pprVar11;
  uint uVar12;
  xmlNode *local_80;
  xmlNode *chain;
  char *str;
  xmlAttr *attr;
  rnndelem *res;
  int width;
  rnndelem *delem;
  xmlNode *chain_1;
  xmlAttr *attr_2;
  rnndelem *res_2;
  xmlAttr *attr_1;
  rnndelem *res_1;
  xmlNode *node_local;
  char *file_local;
  rnndb *db_local;
  
  iVar4 = strcmp((char *)node->name,"use-group");
  if (iVar4 == 0) {
    db_local = (rnndb *)calloc(0x110,1);
    *(char **)&db_local[1].estatus = file;
    (db_local->copyright).firstyear = 3;
    for (res_2 = (rnndelem *)node->properties; res_2 != (rnndelem *)0x0;
        res_2 = (rnndelem *)res_2->subelems) {
      iVar4 = strcmp(*(char **)&res_2->width,"name");
      if (iVar4 == 0) {
        pcVar5 = getattrib(db,file,(uint)node->line,(xmlAttr *)res_2);
        pcVar5 = strdup(pcVar5);
        (db_local->copyright).license = pcVar5;
      }
      else {
        uVar1._0_4_ = res_2->width;
        uVar1._4_4_ = res_2->access;
        fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,(ulong)node->line,uVar1,
                node->name);
        db->estatus = 1;
      }
    }
    if ((db_local->copyright).license == (char *)0x0) {
      fprintf(_stderr,"%s:%d: nameless use-group\n",file,(ulong)node->line);
      free(db_local);
      db->estatus = 1;
      db_local = (rnndb *)0x0;
    }
  }
  else {
    iVar4 = strcmp((char *)node->name,"stripe");
    if ((iVar4 == 0) || (iVar4 = strcmp((char *)node->name,"array"), iVar4 == 0)) {
      db_local = (rnndb *)calloc(0x110,1);
      iVar4 = strcmp((char *)node->name,"stripe");
      uVar12 = 2;
      if (iVar4 != 0) {
        uVar12 = 1;
      }
      (db_local->copyright).firstyear = uVar12;
      db_local->enums = (rnnenum **)0x1;
      *(char **)&db_local[1].estatus = file;
      for (chain_1 = (xmlNode *)node->properties; chain_1 != (xmlNode *)0x0; chain_1 = chain_1->next
          ) {
        iVar4 = strcmp((char *)chain_1->name,"name");
        if (iVar4 == 0) {
          pcVar5 = getattrib(db,file,(uint)node->line,(xmlAttr *)chain_1);
          pcVar5 = strdup(pcVar5);
          (db_local->copyright).license = pcVar5;
        }
        else {
          iVar4 = strcmp((char *)chain_1->name,"offset");
          if (iVar4 == 0) {
            uVar6 = getnumattrib(db,file,(uint)node->line,(xmlAttr *)chain_1);
            (db_local->copyright).authorsnum = (int)uVar6;
            (db_local->copyright).authorsmax = (int)(uVar6 >> 0x20);
          }
          else {
            iVar4 = strcmp((char *)chain_1->name,"length");
            if (iVar4 == 0) {
              pprVar7 = (rnnenum **)getnumattrib(db,file,(uint)node->line,(xmlAttr *)chain_1);
              db_local->enums = pprVar7;
            }
            else {
              iVar4 = strcmp((char *)chain_1->name,"stride");
              if (iVar4 == 0) {
                uVar6 = getnumattrib(db,file,(uint)node->line,(xmlAttr *)chain_1);
                db_local->enumsnum = (int)uVar6;
                db_local->enumsmax = (int)(uVar6 >> 0x20);
              }
              else {
                iVar4 = strcmp((char *)chain_1->name,"prefix");
                if (iVar4 == 0) {
                  pcVar5 = getattrib(db,file,(uint)node->line,(xmlAttr *)chain_1);
                  pprVar8 = (rnndomain **)strdup(pcVar5);
                  db_local->domains = pprVar8;
                }
                else {
                  iVar4 = strcmp((char *)chain_1->name,"varset");
                  if (iVar4 == 0) {
                    pcVar5 = getattrib(db,file,(uint)node->line,(xmlAttr *)chain_1);
                    pcVar5 = strdup(pcVar5);
                    *(char **)&db_local->domainsnum = pcVar5;
                  }
                  else {
                    iVar4 = strcmp((char *)chain_1->name,"variants");
                    if (iVar4 == 0) {
                      pcVar5 = getattrib(db,file,(uint)node->line,(xmlAttr *)chain_1);
                      pprVar9 = (rnngroup **)strdup(pcVar5);
                      db_local->groups = pprVar9;
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,
                              (ulong)node->line,chain_1->name,node->name);
                      db->estatus = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
      for (delem = (rnndelem *)node->children; delem != (rnndelem *)0x0;
          delem = (rnndelem *)delem->subelems) {
        if (*(int *)&delem->name == 1) {
          prVar10 = trydelem(db,file,(xmlNode *)delem);
          if (prVar10 == (rnndelem *)0x0) {
            iVar4 = trytop(db,file,(xmlNode *)delem);
            if ((iVar4 == 0) && (iVar4 = trydoc(db,file,(xmlNode *)delem), iVar4 == 0)) {
              uVar2._0_4_ = delem->width;
              uVar2._4_4_ = delem->access;
              fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,
                      (ulong)*(ushort *)&(delem->varinfo).varsets,node->name,uVar2);
              db->estatus = 1;
            }
          }
          else {
            if (db_local->bitsetsmax <= db_local->bitsetsnum) {
              if (db_local->bitsetsmax == 0) {
                db_local->bitsetsmax = 0x10;
              }
              else {
                db_local->bitsetsmax = db_local->bitsetsmax << 1;
              }
              pprVar11 = (rnnbitset **)realloc(db_local->bitsets,(long)db_local->bitsetsmax << 3);
              db_local->bitsets = pprVar11;
            }
            iVar4 = db_local->bitsetsnum;
            db_local->bitsetsnum = iVar4 + 1;
            db_local->bitsets[iVar4] = (rnnbitset *)prVar10;
          }
        }
      }
      if (((db_local->copyright).firstyear == 1) &&
         (lVar3._0_4_ = db_local->enumsnum, lVar3._4_4_ = db_local->enumsmax, lVar3 == 0)) {
        fprintf(_stderr,"%s: Array %s\'s stride is undefined. Aborting.\n",file,
                (db_local->copyright).license);
        exit(-1);
      }
    }
    else {
      iVar4 = strcmp((char *)node->name,"reg8");
      if (iVar4 == 0) {
        res._4_4_ = 8;
      }
      else {
        iVar4 = strcmp((char *)node->name,"reg16");
        if (iVar4 == 0) {
          res._4_4_ = 0x10;
        }
        else {
          iVar4 = strcmp((char *)node->name,"reg32");
          if (iVar4 == 0) {
            res._4_4_ = 0x20;
          }
          else {
            iVar4 = strcmp((char *)node->name,"reg64");
            if (iVar4 != 0) {
              return (rnndelem *)0x0;
            }
            res._4_4_ = 0x40;
          }
        }
      }
      db_local = (rnndb *)calloc(0x110,1);
      *(char **)&db_local[1].estatus = file;
      (db_local->copyright).firstyear = 0;
      *(undefined4 *)&(db_local->copyright).authors = res._4_4_;
      db_local->enums = (rnnenum **)0x1;
      *(undefined4 *)((long)&(db_local->copyright).authors + 4) = 2;
      for (str = (char *)node->properties; str != (char *)0x0; str = *(char **)(str + 0x30)) {
        iVar4 = strcmp(*(char **)(str + 0x10),"name");
        if (iVar4 == 0) {
          pcVar5 = getattrib(db,file,(uint)node->line,(xmlAttr *)str);
          pcVar5 = strdup(pcVar5);
          (db_local->copyright).license = pcVar5;
        }
        else {
          iVar4 = strcmp(*(char **)(str + 0x10),"offset");
          if (iVar4 == 0) {
            uVar6 = getnumattrib(db,file,(uint)node->line,(xmlAttr *)str);
            (db_local->copyright).authorsnum = (int)uVar6;
            (db_local->copyright).authorsmax = (int)(uVar6 >> 0x20);
          }
          else {
            iVar4 = strcmp(*(char **)(str + 0x10),"length");
            if (iVar4 == 0) {
              pprVar7 = (rnnenum **)getnumattrib(db,file,(uint)node->line,(xmlAttr *)str);
              db_local->enums = pprVar7;
            }
            else {
              iVar4 = strcmp(*(char **)(str + 0x10),"stride");
              if (iVar4 == 0) {
                uVar6 = getnumattrib(db,file,(uint)node->line,(xmlAttr *)str);
                db_local->enumsnum = (int)uVar6;
                db_local->enumsmax = (int)(uVar6 >> 0x20);
              }
              else {
                iVar4 = strcmp(*(char **)(str + 0x10),"varset");
                if (iVar4 == 0) {
                  pcVar5 = getattrib(db,file,(uint)node->line,(xmlAttr *)str);
                  pcVar5 = strdup(pcVar5);
                  *(char **)&db_local->domainsnum = pcVar5;
                }
                else {
                  iVar4 = strcmp(*(char **)(str + 0x10),"variants");
                  if (iVar4 == 0) {
                    pcVar5 = getattrib(db,file,(uint)node->line,(xmlAttr *)str);
                    pprVar9 = (rnngroup **)strdup(pcVar5);
                    db_local->groups = pprVar9;
                  }
                  else {
                    iVar4 = strcmp(*(char **)(str + 0x10),"access");
                    if (iVar4 == 0) {
                      pcVar5 = getattrib(db,file,(uint)node->line,(xmlAttr *)str);
                      iVar4 = strcmp(pcVar5,"r");
                      if (iVar4 == 0) {
                        *(undefined4 *)((long)&(db_local->copyright).authors + 4) = 0;
                      }
                      else {
                        iVar4 = strcmp(pcVar5,"w");
                        if (iVar4 == 0) {
                          *(undefined4 *)((long)&(db_local->copyright).authors + 4) = 1;
                        }
                        else {
                          iVar4 = strcmp(pcVar5,"rw");
                          if (iVar4 == 0) {
                            *(undefined4 *)((long)&(db_local->copyright).authors + 4) = 2;
                          }
                          else {
                            fprintf(_stderr,"%s:%d: wrong access type \"%s\" for register\n",file,
                                    (ulong)node->line,pcVar5);
                          }
                        }
                      }
                    }
                    else {
                      iVar4 = trytypeattr(db,file,node,(xmlAttr *)str,
                                          (rnntypeinfo *)&db_local->estatus);
                      if (iVar4 == 0) {
                        fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for register\n",file,
                                (ulong)node->line,*(undefined8 *)(str + 0x10));
                        db->estatus = 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      for (local_80 = node->children; local_80 != (xmlNode *)0x0; local_80 = local_80->next) {
        if ((((local_80->type == XML_ELEMENT_NODE) &&
             (iVar4 = trytypetag(db,file,local_80,(rnntypeinfo *)&db_local->estatus), iVar4 == 0))
            && (iVar4 = trytop(db,file,local_80), iVar4 == 0)) &&
           (iVar4 = trydoc(db,file,local_80), iVar4 == 0)) {
          fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)local_80->line,node->name,
                  local_80->name);
          db->estatus = 1;
        }
      }
      if ((db_local->copyright).license == (char *)0x0) {
        fprintf(_stderr,"%s:%d: nameless register\n",file,(ulong)node->line);
        db->estatus = 1;
        db_local = (rnndb *)0x0;
      }
    }
  }
  return (rnndelem *)db_local;
}

Assistant:

static struct rnndelem *trydelem(struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "use-group")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->file = file;
		res->type = RNN_ETYPE_USE_GROUP;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!res->name) {
			fprintf (stderr, "%s:%d: nameless use-group\n", file, node->line);
			free(res);
			db->estatus = 1;
			return 0;
		}
		return res;
	} else if (!strcmp(node->name, "stripe") || !strcmp(node->name, "array")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->type = (strcmp(node->name, "stripe")?RNN_ETYPE_ARRAY:RNN_ETYPE_STRIPE);
		res->length = 1;
		res->file = file;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "offset")) {
				res->offset = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "length")) {
				res->length = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "stride")) {
				res->stride = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "prefix")) {
				res->varinfo.prefixstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "varset")) {
				res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "variants")) {
				res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		xmlNode *chain = node->children;
		while (chain) {
			struct rnndelem *delem;
			if (chain->type != XML_ELEMENT_NODE) {
			} else if ((delem = trydelem(db, file, chain))) {
				ADDARRAY(res->subelems, delem);
			} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
				fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
				db->estatus = 1;
			}
			chain = chain->next;
		}

		/* Sanity checking */
		if (res->type == RNN_ETYPE_ARRAY && res->stride == 0) {
			fprintf(stderr, "%s: Array %s's stride is undefined. Aborting.\n", file, res->name);
			exit(-1);
		}
		return res;

	}
	int width;
	if (!strcmp(node->name, "reg8"))
		width = 8;
	else if (!strcmp(node->name, "reg16"))
		width = 16;
	else if (!strcmp(node->name, "reg32"))
		width = 32;
	else if (!strcmp(node->name, "reg64"))
		width = 64;
	else
		return 0;
	struct rnndelem *res = calloc(sizeof *res, 1);
	res->file = file;
	res->type = RNN_ETYPE_REG;
	res->width = width;
	res->length = 1;
	res->access = RNN_ACCESS_RW;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			res->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "offset")) {
			res->offset = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "length")) {
			res->length = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "stride")) {
			res->stride = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "varset")) {
			res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "access")) {
			char *str = getattrib(db, file, node->line, attr);
			if (!strcmp(str, "r"))
				res->access = RNN_ACCESS_R;
			else if (!strcmp(str, "w"))
				res->access = RNN_ACCESS_W;
			else if (!strcmp(str, "rw"))
				res->access = RNN_ACCESS_RW;
			else
				fprintf (stderr, "%s:%d: wrong access type \"%s\" for register\n", file, node->line, str);
		} else if (!trytypeattr(db, file, node, attr, &res->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for register\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &res->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!res->name) {
		fprintf (stderr, "%s:%d: nameless register\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
	}
	return res;
}